

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCopyMultiPartFile.cpp
# Opt level: O3

void anon_unknown.dwarf_1f7001::setInputDeepFrameBuffer
               (DeepFrameBuffer *frameBuffer,int pixelType,Array2D<unsigned_int_*> *uData,
               Array2D<float_*> *fData,Array2D<Imath_3_2::half_*> *hData,int width,int height)

{
  ulong uVar1;
  uint **ppuVar2;
  float **ppfVar3;
  half **pphVar4;
  char *pcVar5;
  long lVar6;
  DeepSlice aDStack_68 [56];
  
  if (pixelType == 2) {
    lVar6 = (long)width;
    uVar1 = height * lVar6;
    pphVar4 = (half **)operator_new__(-(ulong)(uVar1 >> 0x3d != 0) | uVar1 * 8);
    if (hData->_data != (half **)0x0) {
      operator_delete__(hData->_data);
    }
    hData->_sizeX = (long)height;
    hData->_sizeY = lVar6;
    hData->_data = pphVar4;
    Imf_3_2::DeepSlice::DeepSlice
              (aDStack_68,HALF,(char *)pphVar4,8,lVar6 << 3,2,1,1,0.0,false,false);
    pcVar5 = "HALF";
  }
  else if (pixelType == 1) {
    lVar6 = (long)width;
    uVar1 = height * lVar6;
    ppfVar3 = (float **)operator_new__(-(ulong)(uVar1 >> 0x3d != 0) | uVar1 * 8);
    if (fData->_data != (float **)0x0) {
      operator_delete__(fData->_data);
    }
    fData->_sizeX = (long)height;
    fData->_sizeY = lVar6;
    fData->_data = ppfVar3;
    Imf_3_2::DeepSlice::DeepSlice
              (aDStack_68,FLOAT,(char *)ppfVar3,8,lVar6 << 3,4,1,1,0.0,false,false);
    pcVar5 = "FLOAT";
  }
  else {
    if (pixelType != 0) {
      return;
    }
    lVar6 = (long)width;
    uVar1 = height * lVar6;
    ppuVar2 = (uint **)operator_new__(-(ulong)(uVar1 >> 0x3d != 0) | uVar1 * 8);
    if (uData->_data != (uint **)0x0) {
      operator_delete__(uData->_data);
    }
    uData->_sizeX = (long)height;
    uData->_sizeY = lVar6;
    uData->_data = ppuVar2;
    Imf_3_2::DeepSlice::DeepSlice
              (aDStack_68,UINT,(char *)ppuVar2,8,lVar6 << 3,4,1,1,0.0,false,false);
    pcVar5 = "UINT";
  }
  Imf_3_2::DeepFrameBuffer::insert((char *)frameBuffer,(DeepSlice *)pcVar5);
  return;
}

Assistant:

void
setInputDeepFrameBuffer (
    DeepFrameBuffer&        frameBuffer,
    int                     pixelType,
    Array2D<unsigned int*>& uData,
    Array2D<float*>&        fData,
    Array2D<half*>&         hData,
    int                     width,
    int                     height)
{
    switch (pixelType)
    {
        case 0:
            uData.resizeErase (height, width);
            frameBuffer.insert (
                "UINT",
                DeepSlice (
                    IMF::UINT,
                    (char*) (&uData[0][0]),
                    sizeof (uData[0][0]) * 1,
                    sizeof (uData[0][0]) * width,
                    sizeof (unsigned int)));
            break;
        case 1:
            fData.resizeErase (height, width);
            frameBuffer.insert (
                "FLOAT",
                DeepSlice (
                    IMF::FLOAT,
                    (char*) (&fData[0][0]),
                    sizeof (fData[0][0]) * 1,
                    sizeof (fData[0][0]) * width,
                    sizeof (float)));
            break;
        case 2:
            hData.resizeErase (height, width);
            frameBuffer.insert (
                "HALF",
                DeepSlice (
                    IMF::HALF,
                    (char*) (&hData[0][0]),
                    sizeof (hData[0][0]) * 1,
                    sizeof (hData[0][0]) * width,
                    sizeof (half)));
            break;
    }
}